

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v10::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int b;
  bigit bVar2;
  bigit bVar3;
  bigit bVar4;
  ulong uVar5;
  bigit rhs_bigit;
  double_bigit sum;
  int i;
  int min_exp;
  double_bigit borrow;
  int iStack_30;
  anon_class_1_0_00000001 get_bigit;
  int num_rhs_bigits;
  int max_lhs_bigits;
  anon_class_1_0_00000001 maximum;
  anon_class_1_0_00000001 minimum;
  bigint *rhs_local;
  bigint *lhs2_local;
  bigint *lhs1_local;
  
  _max_lhs_bigits = rhs;
  iVar1 = bigint::num_bigits(lhs1);
  b = bigint::num_bigits(lhs2);
  iStack_30 = add_compare::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&num_rhs_bigits + 2),iVar1,b);
  borrow._4_4_ = bigint::num_bigits(_max_lhs_bigits);
  if (iStack_30 + 1 < borrow._4_4_) {
    lhs1_local._4_4_ = -1;
  }
  else if (borrow._4_4_ < iStack_30) {
    lhs1_local._4_4_ = 1;
  }
  else {
    _i = 0;
    iVar1 = add_compare::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&num_rhs_bigits + 3),lhs1->exp_,lhs2->exp_)
    ;
    iVar1 = add_compare::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&num_rhs_bigits + 3),iVar1,
                       _max_lhs_bigits->exp_);
    sum._0_4_ = borrow._4_4_;
    while (sum._0_4_ = (int)sum + -1, iVar1 <= (int)sum) {
      bVar2 = add_compare::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&borrow + 3),lhs1,(int)sum);
      bVar3 = add_compare::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&borrow + 3),lhs2,(int)sum);
      bVar4 = add_compare::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&borrow + 3),_max_lhs_bigits,(int)sum);
      if ((ulong)bVar4 + _i < (ulong)bVar2 + (ulong)bVar3) {
        return 1;
      }
      uVar5 = ((ulong)bVar4 + _i) - ((ulong)bVar2 + (ulong)bVar3);
      if (1 < uVar5) {
        return -1;
      }
      _i = uVar5 << 0x20;
    }
    lhs1_local._4_4_ = 0;
    if (_i != 0) {
      lhs1_local._4_4_ = -1;
    }
  }
  return lhs1_local._4_4_;
}

Assistant:

FMT_CONSTEXPR20 auto add_compare(const bigint& lhs1,
                                          const bigint& lhs2, const bigint& rhs)
      -> int {
    auto minimum = [](int a, int b) { return a < b ? a : b; };
    auto maximum = [](int a, int b) { return a > b ? a : b; };
    int max_lhs_bigits = maximum(lhs1.num_bigits(), lhs2.num_bigits());
    int num_rhs_bigits = rhs.num_bigits();
    if (max_lhs_bigits + 1 < num_rhs_bigits) return -1;
    if (max_lhs_bigits > num_rhs_bigits) return 1;
    auto get_bigit = [](const bigint& n, int i) -> bigit {
      return i >= n.exp_ && i < n.num_bigits() ? n[i - n.exp_] : 0;
    };
    double_bigit borrow = 0;
    int min_exp = minimum(minimum(lhs1.exp_, lhs2.exp_), rhs.exp_);
    for (int i = num_rhs_bigits - 1; i >= min_exp; --i) {
      double_bigit sum =
          static_cast<double_bigit>(get_bigit(lhs1, i)) + get_bigit(lhs2, i);
      bigit rhs_bigit = get_bigit(rhs, i);
      if (sum > rhs_bigit + borrow) return 1;
      borrow = rhs_bigit + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= bigit_bits;
    }
    return borrow != 0 ? -1 : 0;
  }